

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderOperatorTests.cpp
# Opt level: O3

void deqp::gles3::Functional::eval_distance_vec3(ShaderEvalContext *c)

{
  int i;
  long lVar1;
  float sqSum;
  float fVar2;
  Vector<float,_3> res;
  float local_30 [4];
  undefined8 local_20;
  float local_18;
  float local_14;
  undefined8 local_10;
  
  local_14 = c->in[0].m_data[2];
  local_10 = *(undefined8 *)c->in[0].m_data;
  local_20 = *(undefined8 *)(c->in[1].m_data + 1);
  local_18 = c->in[1].m_data[0];
  local_30[2] = 0.0;
  local_30[0] = 0.0;
  local_30[1] = 0.0;
  lVar1 = 0;
  do {
    local_30[lVar1] = (&local_14)[lVar1] - *(float *)((long)&local_20 + lVar1 * 4);
    lVar1 = lVar1 + 1;
  } while (lVar1 != 3);
  fVar2 = 0.0;
  lVar1 = 0;
  do {
    fVar2 = fVar2 + local_30[lVar1] * local_30[lVar1];
    lVar1 = lVar1 + 1;
  } while (lVar1 != 3);
  if (fVar2 < 0.0) {
    fVar2 = sqrtf(fVar2);
  }
  else {
    fVar2 = SQRT(fVar2);
  }
  (c->color).m_data[0] = fVar2;
  return;
}

Assistant:

void eval_cross_vec3 (ShaderEvalContext& c) { c.color.xyz()	= cross(c.in[0].swizzle(2, 0, 1), c.in[1].swizzle(1, 2, 0)); }